

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

int Extra_TruthVarsAntiSymm(uint *pTruth,int nVars,int iVar0,int iVar1)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (9 < nVars) {
    __assert_fail("nVars <= 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilTruth.c"
                  ,0x2b7,"int Extra_TruthVarsAntiSymm(unsigned int *, int, int, int)");
  }
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  uVar5 = (ulong)uVar1;
  uVar4 = uVar5 + 1;
  do {
    Extra_TruthVarsSymm::uTemp1[uVar4 + 0xe] = pTruth[uVar4 - 2];
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  Extra_TruthCofactor0(Extra_TruthVarsAntiSymm::uTemp0,nVars,iVar0);
  Extra_TruthCofactor0(Extra_TruthVarsAntiSymm::uTemp0,nVars,iVar1);
  uVar4 = uVar5 + 1;
  do {
    Extra_TruthVarsAntiSymm::uTemp0[uVar4 + 0xe] = pTruth[uVar4 - 2];
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  Extra_TruthCofactor1(Extra_TruthVarsAntiSymm::uTemp1,nVars,iVar0);
  Extra_TruthCofactor1(Extra_TruthVarsAntiSymm::uTemp1,nVars,iVar1);
  do {
    if ((long)uVar5 < 1) {
      return 1;
    }
    lVar2 = uVar5 + 0xf;
    lVar3 = uVar5 + 0xf;
    uVar5 = uVar5 - 1;
  } while (Extra_TruthVarsSymm::uTemp1[lVar2] == Extra_TruthVarsAntiSymm::uTemp0[lVar3]);
  return 0;
}

Assistant:

int Extra_TruthVarsAntiSymm( unsigned * pTruth, int nVars, int iVar0, int iVar1 )
{
    static unsigned uTemp0[16], uTemp1[16];
    assert( nVars <= 9 );
    // compute Cof00
    Extra_TruthCopy( uTemp0, pTruth, nVars );
    Extra_TruthCofactor0( uTemp0, nVars, iVar0 );
    Extra_TruthCofactor0( uTemp0, nVars, iVar1 );
    // compute Cof11
    Extra_TruthCopy( uTemp1, pTruth, nVars );
    Extra_TruthCofactor1( uTemp1, nVars, iVar0 );
    Extra_TruthCofactor1( uTemp1, nVars, iVar1 );
    // compare
    return Extra_TruthIsEqual( uTemp0, uTemp1, nVars );
}